

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O1

int __thiscall
tetgenmesh::tri_edge_2d
          (tetgenmesh *this,point A,point B,point C,point P,point Q,point R,int level,int *types,
          int *pos)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  uint uVar5;
  uint uVar6;
  point pdVar7;
  double *pdVar8;
  uint uVar9;
  point pdVar10;
  point pdVar11;
  uint uVar12;
  point pdVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double n [3];
  double abovept [3];
  int local_b4;
  point local_90;
  double local_68;
  double local_60;
  double local_58;
  double local_48;
  double local_40;
  double local_38;
  
  if (R == (point)0x0) {
    facenormal(this,A,B,C,&local_68,1,(double *)0x0);
    dVar20 = local_58;
    dVar18 = local_60;
    dVar19 = local_68;
    dVar14 = local_58 * local_58 + local_68 * local_68 + local_60 * local_60;
    if (dVar14 < 0.0) {
      dVar14 = sqrt(dVar14);
    }
    else {
      dVar14 = SQRT(dVar14);
    }
    if ((dVar14 != 0.0) || (NAN(dVar14))) {
      dVar19 = dVar19 / dVar14;
      dVar18 = dVar18 / dVar14;
      dVar20 = dVar20 / dVar14;
      dVar15 = (B[2] - A[2]) * (B[2] - A[2]) + (*B - *A) * (*B - *A) + (B[1] - A[1]) * (B[1] - A[1])
      ;
      local_68 = dVar19;
      local_60 = dVar18;
      local_58 = dVar20;
      if (dVar15 < 0.0) {
        dVar15 = sqrt(dVar15);
      }
      else {
        dVar15 = SQRT(dVar15);
      }
      dVar16 = (C[2] - B[2]) * (C[2] - B[2]) + (*C - *B) * (*C - *B) + (C[1] - B[1]) * (C[1] - B[1])
      ;
      if (dVar16 < 0.0) {
        dVar16 = sqrt(dVar16);
      }
      else {
        dVar16 = SQRT(dVar16);
      }
      dVar17 = (A[2] - C[2]) * (A[2] - C[2]) + (*A - *C) * (*A - *C) + (A[1] - C[1]) * (A[1] - C[1])
      ;
      if (dVar17 < 0.0) {
        dVar17 = sqrt(dVar17);
      }
      else {
        dVar17 = SQRT(dVar17);
      }
      dVar15 = (dVar15 + dVar16 + dVar17) / 3.0;
      local_48 = dVar19 * dVar15 + *A;
      R = &local_48;
      local_40 = dVar18 * dVar15 + A[1];
      local_38 = dVar15 * dVar20 + A[2];
    }
    else {
      R = (double *)0x0;
    }
    if ((dVar14 == 0.0) && (!NAN(dVar14))) {
      return 0;
    }
  }
  dVar19 = orient3d(P,Q,R,A);
  dVar18 = orient3d(P,Q,R,B);
  dVar20 = orient3d(P,Q,R,C);
  pdVar7 = Q;
  pdVar8 = Q;
  pdVar10 = C;
  local_90 = P;
  if (0.0 <= dVar19) {
    if (dVar19 <= 0.0) {
      if (0.0 <= dVar18) {
        if (dVar18 <= 0.0) {
          uVar6 = 2;
          bVar1 = 0.0 <= dVar20;
          if (!bVar1) {
            pdVar8 = P;
            local_90 = Q;
          }
          bVar4 = !bVar1 || 0.0 < dVar20;
          uVar9 = (uint)!bVar1;
          uVar5 = 1;
          uVar12 = (uint)bVar1;
          local_b4 = 0;
          bVar2 = false;
          bVar1 = false;
          bVar3 = false;
          goto LAB_001119c1;
        }
        if (dVar20 < 0.0) {
          local_b4 = 0;
          uVar5 = 1;
          uVar6 = 2;
          uVar12 = 0;
          uVar9 = 1;
          pdVar7 = P;
          pdVar10 = C;
          pdVar11 = A;
          pdVar13 = B;
          local_90 = Q;
          goto LAB_001117a8;
        }
        bVar2 = 0.0 < dVar20;
        pdVar10 = B;
        pdVar7 = A;
        pdVar11 = C;
        if (0.0 < dVar20) {
          pdVar10 = A;
          pdVar7 = C;
          pdVar8 = P;
          pdVar11 = B;
          local_90 = Q;
        }
        A = pdVar11;
        B = pdVar7;
        uVar6 = (uint)(dVar20 <= 0.0);
        uVar5 = (uint)bVar2 * 2;
        local_b4 = 2 - (uint)bVar2;
        bVar3 = false;
        uVar12 = uVar6;
        uVar9 = (uint)bVar2;
      }
      else {
        if (dVar20 < 0.0) {
          local_b4 = 1;
          uVar5 = 2;
          uVar6 = 0;
          uVar12 = 1;
          uVar9 = 0;
          pdVar10 = A;
          pdVar11 = B;
          A = C;
LAB_001115a2:
          bVar2 = true;
          bVar1 = false;
          P = pdVar7;
          B = pdVar10;
          C = pdVar11;
          goto LAB_001115aa;
        }
        uVar9 = (uint)(dVar20 <= 0.0);
        bVar3 = 0.0 < dVar20;
        uVar5 = (uint)bVar3;
        pdVar7 = A;
        if (dVar20 <= 0.0) {
          pdVar10 = B;
          pdVar7 = C;
          pdVar8 = P;
          B = A;
          local_90 = Q;
        }
        A = pdVar7;
        uVar6 = bVar3 + 1;
        local_b4 = (uint)(dVar20 <= 0.0) * 2;
        bVar2 = false;
        uVar12 = uVar5;
      }
LAB_00111965:
      bVar4 = dVar20 <= 0.0;
      bVar1 = false;
    }
    else {
      if (0.0 <= dVar18) {
        if (0.0 < dVar18) {
          uVar5 = 1;
          if (0.0 <= dVar20) {
            if (0.0 < dVar20) {
              return 0;
            }
            local_b4 = 0;
            uVar6 = 2;
            uVar12 = 0;
            uVar9 = 1;
            pdVar7 = P;
            pdVar11 = A;
            A = B;
            local_90 = Q;
            goto LAB_001115a2;
          }
          uVar6 = 2;
          local_b4 = 0;
          uVar12 = 0;
          uVar9 = 1;
          pdVar7 = P;
          pdVar11 = A;
          A = B;
          local_90 = Q;
          goto LAB_00111549;
        }
        if (0.0 <= dVar20) {
          bVar2 = 0.0 < dVar20;
          uVar6 = (uint)bVar2;
          pdVar10 = A;
          pdVar7 = B;
          pdVar11 = C;
          if (0.0 < dVar20) {
            pdVar10 = B;
            pdVar7 = C;
            pdVar8 = P;
            pdVar11 = A;
            local_90 = Q;
          }
          B = pdVar11;
          A = pdVar7;
          uVar5 = (uint)(dVar20 <= 0.0) * 2;
          local_b4 = bVar2 + 1;
          bVar3 = false;
          uVar12 = (uint)(dVar20 <= 0.0);
          uVar9 = uVar6;
          goto LAB_00111965;
        }
        local_b4 = 1;
        uVar5 = 2;
        uVar6 = 0;
        uVar12 = 1;
        uVar9 = 0;
        pdVar7 = Q;
        pdVar10 = A;
        pdVar11 = B;
        pdVar13 = C;
LAB_001117a8:
        C = pdVar11;
        B = pdVar10;
        P = pdVar7;
        bVar3 = true;
        bVar2 = false;
        bVar1 = false;
      }
      else if (0.0 <= dVar20) {
        bVar1 = 0.0 < dVar20;
        bVar3 = dVar20 <= 0.0;
        local_b4 = 2;
        uVar5 = 0;
        uVar6 = 1;
        uVar12 = 0;
        uVar9 = 1;
        bVar2 = false;
        pdVar13 = A;
        local_90 = Q;
      }
      else {
        local_b4 = 1;
        uVar5 = 2;
        uVar6 = 0;
        uVar12 = 1;
        uVar9 = 0;
        pdVar10 = A;
        pdVar11 = B;
        A = C;
LAB_00111549:
        bVar1 = true;
        bVar2 = false;
        P = pdVar7;
        B = pdVar10;
        C = pdVar11;
LAB_001115aa:
        bVar3 = false;
        pdVar13 = A;
      }
LAB_001115b2:
      bVar4 = false;
      pdVar8 = P;
      pdVar10 = B;
      A = C;
      B = pdVar13;
    }
  }
  else if (0.0 <= dVar18) {
    if (0.0 < dVar18) {
      if (dVar20 < 0.0) {
        local_b4 = 2;
        uVar5 = 0;
        uVar6 = 1;
        uVar12 = 1;
        uVar9 = 0;
        pdVar10 = B;
        pdVar11 = C;
        goto LAB_00111549;
      }
      bVar1 = 0.0 < dVar20;
      uVar9 = (uint)bVar1;
      pdVar7 = B;
      pdVar10 = Q;
      if (0.0 < dVar20) {
        pdVar7 = A;
        A = C;
        pdVar10 = P;
        C = B;
        local_90 = Q;
      }
      P = pdVar10;
      B = pdVar7;
      bVar3 = dVar20 <= 0.0;
      uVar12 = (uint)bVar3;
      uVar5 = (uint)bVar1 * 2;
      local_b4 = 2 - (uint)bVar1;
      bVar2 = false;
      pdVar13 = A;
      uVar6 = uVar12;
      goto LAB_001115b2;
    }
    if (dVar20 < 0.0) {
      local_b4 = 2;
      uVar5 = 0;
      uVar6 = 1;
      uVar12 = 1;
      uVar9 = 0;
      pdVar10 = B;
      pdVar11 = C;
      goto LAB_001115a2;
    }
    bVar3 = 0.0 < dVar20;
    bVar4 = dVar20 <= 0.0;
    local_b4 = 1;
    uVar5 = 2;
    uVar6 = 0;
    uVar12 = 0;
    uVar9 = 1;
    bVar2 = false;
    bVar1 = false;
    pdVar8 = P;
    pdVar10 = A;
    A = B;
    B = C;
    local_90 = Q;
  }
  else {
    if (dVar20 < 0.0) {
      return 0;
    }
    bVar1 = 0.0 < dVar20;
    bVar2 = dVar20 <= 0.0;
    local_b4 = 0;
    uVar5 = 1;
    uVar6 = 2;
    uVar12 = 1;
    uVar9 = 0;
    bVar3 = false;
    bVar4 = false;
  }
LAB_001119c1:
  dVar19 = orient3d(A,pdVar10,R,pdVar8);
  dVar18 = orient3d(B,pdVar10,R,local_90);
  if (0.0 < dVar19) {
    return 0;
  }
  if (dVar18 < 0.0) {
    return 0;
  }
  if (level == 0) {
    return 1;
  }
  if (bVar2) {
    if ((dVar19 != 0.0) || (NAN(dVar19))) {
      if ((dVar18 != 0.0) || (NAN(dVar18))) {
        *types = 7;
      }
      else {
        *types = 2;
      }
      *pos = uVar6;
    }
    else {
      *types = 2;
      *pos = uVar6;
      uVar9 = uVar12;
    }
    pos[1] = uVar9;
    types[1] = 0;
    return 4;
  }
  dVar20 = orient3d(A,pdVar10,R,local_90);
  dVar14 = orient3d(B,pdVar10,R,pdVar8);
  if (!bVar1) {
    if (bVar3) {
      if (0.0 <= dVar19) {
        *types = 2;
        *pos = local_b4;
        goto LAB_00111c0a;
      }
      if (dVar20 <= 0.0) {
        if ((dVar20 != 0.0) || (NAN(dVar20))) {
          if (0.0 < dVar18) {
            if (dVar14 <= 0.0) {
              *types = 6;
              *pos = 3;
              pos[1] = uVar9;
              if ((dVar14 != 0.0) || (NAN(dVar14))) {
                *types = 8;
                *pos = uVar5;
                pos[1] = uVar9;
                return 4;
              }
              *types = 5;
              *pos = uVar5;
            }
            else {
              *types = 6;
              *pos = 3;
              pos[1] = uVar9;
              *types = 6;
              *pos = 3;
            }
            pos[1] = uVar12;
            return 4;
          }
          goto LAB_00111dad;
        }
        if (dVar14 <= 0.0) {
          *types = 2;
          goto LAB_00111dd4;
        }
        *types = 2;
      }
      else {
        if (dVar14 <= 0.0) {
          *types = 7;
LAB_00111dd4:
          *pos = local_b4;
          goto LAB_00111ddc;
        }
        *types = 7;
      }
      *pos = local_b4;
LAB_00111c91:
      pos[1] = uVar9;
      types[1] = 6;
      pos[2] = 3;
      goto LAB_00111df6;
    }
    if (!bVar4) {
      return 4;
    }
    if (0.0 <= dVar19) {
      *types = 2;
      *pos = local_b4;
      pos[1] = uVar12;
      goto LAB_00111ccb;
    }
    if (0.0 < dVar20) {
      if (dVar14 <= 0.0) {
        *types = 7;
LAB_00111e37:
        *pos = local_b4;
        pos[1] = uVar9;
        if ((dVar14 != 0.0) || (NAN(dVar14))) {
LAB_00111f4c:
          types[1] = 7;
          pos[2] = uVar5;
          pos[3] = uVar9;
          return 4;
        }
        types[1] = 2;
        pos[2] = uVar5;
        goto LAB_00111eb4;
      }
      *types = 7;
LAB_00111d59:
      *pos = local_b4;
      pos[1] = uVar9;
      types[1] = 5;
      pos[2] = local_b4;
LAB_00111eb4:
      pos[3] = uVar12;
      return 4;
    }
    if ((dVar20 != 0.0) || (NAN(dVar20))) {
      if (0.0 < dVar18) {
        if (0.0 < dVar14) {
          *types = 5;
          *pos = local_b4;
          pos[1] = uVar9;
          types[1] = 5;
          pos[2] = local_b4;
          goto LAB_00111eb4;
        }
        *types = 5;
        goto LAB_00111e37;
      }
      *types = 2;
      *pos = uVar5;
    }
    else {
      if (0.0 < dVar14) {
        *types = 2;
        goto LAB_00111d59;
      }
      if ((dVar14 != 0.0) || (NAN(dVar14))) {
        *types = 2;
        *pos = local_b4;
        pos[1] = uVar9;
        goto LAB_00111f4c;
      }
      *types = 3;
      *pos = local_b4;
    }
    pos[1] = uVar9;
LAB_00111ccb:
    types[1] = 0;
    return 4;
  }
  if (0.0 <= dVar19) {
    *types = 5;
    *pos = uVar6;
LAB_00111c0a:
    pos[1] = uVar12;
    types[1] = 0;
    return 4;
  }
  if (dVar20 <= 0.0) {
    if ((dVar20 == 0.0) && (!NAN(dVar20))) {
      if (0.0 < dVar14) {
        *types = 5;
        goto LAB_00111beb;
      }
      *types = 5;
      goto LAB_00111d1d;
    }
    if (dVar18 <= 0.0) {
LAB_00111dad:
      *types = 5;
      *pos = uVar5;
      pos[1] = uVar9;
      types[1] = 0;
      return 4;
    }
    if (0.0 < dVar14) {
      *types = 6;
      *pos = 3;
      pos[1] = uVar9;
      types[1] = 6;
      pos[2] = 3;
      goto LAB_00111df6;
    }
    *types = 6;
    *pos = 3;
  }
  else {
    if (0.0 < dVar14) {
      *types = 8;
LAB_00111beb:
      *pos = uVar6;
      goto LAB_00111c91;
    }
    *types = 8;
LAB_00111d1d:
    *pos = uVar6;
  }
LAB_00111ddc:
  pos[1] = uVar9;
  if ((dVar14 != 0.0) || (NAN(dVar14))) {
    types[1] = 8;
    pos[2] = uVar5;
    pos[3] = uVar9;
    return 4;
  }
  types[1] = 5;
  pos[2] = uVar5;
LAB_00111df6:
  pos[3] = uVar12;
  return 4;
}

Assistant:

int tetgenmesh::tri_edge_2d(point A, point B, point C, point P, point Q, 
                            point R, int level, int *types, int *pos)
{
  point U[3], V[3];  // The permuted vectors of points.
  int pu[3], pv[3];  // The original positions of points.
  REAL abovept[3];
  REAL sA, sB, sC;
  REAL s1, s2, s3, s4;
  int z1;

  if (R == NULL) {
    // Calculate a lift point.
    if (1) {
      REAL n[3], len;
      // Calculate a lift point, saved in dummypoint.
      facenormal(A, B, C, n, 1, NULL);
      len = sqrt(dot(n, n));
      if (len != 0) {
        n[0] /= len;
        n[1] /= len;
        n[2] /= len;
        len = distance(A, B);
        len += distance(B, C);
        len += distance(C, A);
        len /= 3.0;
        R = abovept; //dummypoint;
        R[0] = A[0] + len * n[0];
        R[1] = A[1] + len * n[1];
        R[2] = A[2] + len * n[2];
      } else {
        // The triangle [A,B,C] is (nearly) degenerate, i.e., it is (close)
        //   to a line.  We need a line-line intersection test.
        // !!! A non-save return value.!!!
        return 0;  // DISJOINT
      }
    }
  }

  // Test A's, B's, and C's orientations wrt plane PQR. 
  sA = orient3d(P, Q, R, A);
  sB = orient3d(P, Q, R, B);
  sC = orient3d(P, Q, R, C);


  if (sA < 0) {
    if (sB < 0) {
      if (sC < 0) { // (---).
        return 0; 
      } else {
        if (sC > 0) { // (--+).
          // All points are in the right positions.
          SETVECTOR3(U, A, B, C);  // I3
          SETVECTOR3(V, P, Q, R);  // I2
          SETVECTOR3(pu, 0, 1, 2);
          SETVECTOR3(pv, 0, 1, 2);
          z1 = 0;
        } else { // (--0).
          SETVECTOR3(U, A, B, C);  // I3
          SETVECTOR3(V, P, Q, R);  // I2
          SETVECTOR3(pu, 0, 1, 2);
          SETVECTOR3(pv, 0, 1, 2);
          z1 = 1;
        }
      }
    } else { 
      if (sB > 0) {
        if (sC < 0) { // (-+-).
          SETVECTOR3(U, C, A, B);  // PT = ST
          SETVECTOR3(V, P, Q, R);  // I2
          SETVECTOR3(pu, 2, 0, 1);
          SETVECTOR3(pv, 0, 1, 2);
          z1 = 0;
        } else {
          if (sC > 0) { // (-++).
            SETVECTOR3(U, B, C, A);  // PT = ST x ST
            SETVECTOR3(V, Q, P, R);  // PL = SL
            SETVECTOR3(pu, 1, 2, 0);
            SETVECTOR3(pv, 1, 0, 2);
            z1 = 0;
          } else { // (-+0).
            SETVECTOR3(U, C, A, B);  // PT = ST
            SETVECTOR3(V, P, Q, R);  // I2
            SETVECTOR3(pu, 2, 0, 1);
            SETVECTOR3(pv, 0, 1, 2);
            z1 = 2;
          }
        }
      } else {
        if (sC < 0) { // (-0-).
          SETVECTOR3(U, C, A, B);  // PT = ST
          SETVECTOR3(V, P, Q, R);  // I2
          SETVECTOR3(pu, 2, 0, 1);
          SETVECTOR3(pv, 0, 1, 2);
          z1 = 1;
        } else {
          if (sC > 0) { // (-0+).
            SETVECTOR3(U, B, C, A);  // PT = ST x ST
            SETVECTOR3(V, Q, P, R);  // PL = SL
            SETVECTOR3(pu, 1, 2, 0);
            SETVECTOR3(pv, 1, 0, 2);
            z1 = 2;
          } else { // (-00).
            SETVECTOR3(U, B, C, A);  // PT = ST x ST
            SETVECTOR3(V, Q, P, R);  // PL = SL
            SETVECTOR3(pu, 1, 2, 0);
            SETVECTOR3(pv, 1, 0, 2);
            z1 = 3; 
          }
        }
      }
    }
  } else {
    if (sA > 0) {
      if (sB < 0) {
        if (sC < 0) { // (+--).
          SETVECTOR3(U, B, C, A);  // PT = ST x ST
          SETVECTOR3(V, P, Q, R);  // I2
          SETVECTOR3(pu, 1, 2, 0);
          SETVECTOR3(pv, 0, 1, 2);
          z1 = 0;
        } else {
          if (sC > 0) { // (+-+).
            SETVECTOR3(U, C, A, B);  // PT = ST
            SETVECTOR3(V, Q, P, R);  // PL = SL
            SETVECTOR3(pu, 2, 0, 1);
            SETVECTOR3(pv, 1, 0, 2);
            z1 = 0;
          } else { // (+-0).
            SETVECTOR3(U, C, A, B);  // PT = ST
            SETVECTOR3(V, Q, P, R);  // PL = SL
            SETVECTOR3(pu, 2, 0, 1);
            SETVECTOR3(pv, 1, 0, 2);
            z1 = 2;
          }
        }
      } else { 
        if (sB > 0) {
          if (sC < 0) { // (++-).
            SETVECTOR3(U, A, B, C);  // I3
            SETVECTOR3(V, Q, P, R);  // PL = SL
            SETVECTOR3(pu, 0, 1, 2);
            SETVECTOR3(pv, 1, 0, 2);
            z1 = 0;
          } else {
            if (sC > 0) { // (+++).
              return 0; 
            } else { // (++0).
              SETVECTOR3(U, A, B, C);  // I3
              SETVECTOR3(V, Q, P, R);  // PL = SL
              SETVECTOR3(pu, 0, 1, 2);
              SETVECTOR3(pv, 1, 0, 2);
              z1 = 1; 
            }
          }
        } else { // (+0#)
          if (sC < 0) { // (+0-).
            SETVECTOR3(U, B, C, A);  // PT = ST x ST
            SETVECTOR3(V, P, Q, R);  // I2
            SETVECTOR3(pu, 1, 2, 0);
            SETVECTOR3(pv, 0, 1, 2);
            z1 = 2;
          } else {
            if (sC > 0) { // (+0+).
              SETVECTOR3(U, C, A, B);  // PT = ST
              SETVECTOR3(V, Q, P, R);  // PL = SL
              SETVECTOR3(pu, 2, 0, 1);
              SETVECTOR3(pv, 1, 0, 2);
              z1 = 1;
            } else { // (+00).
              SETVECTOR3(U, B, C, A);  // PT = ST x ST
              SETVECTOR3(V, P, Q, R);  // I2
              SETVECTOR3(pu, 1, 2, 0);
              SETVECTOR3(pv, 0, 1, 2);
              z1 = 3; 
            }
          }
        }
      }
    } else { 
      if (sB < 0) {
        if (sC < 0) { // (0--).
          SETVECTOR3(U, B, C, A);  // PT = ST x ST
          SETVECTOR3(V, P, Q, R);  // I2
          SETVECTOR3(pu, 1, 2, 0);
          SETVECTOR3(pv, 0, 1, 2);
          z1 = 1;
        } else {
          if (sC > 0) { // (0-+).
            SETVECTOR3(U, A, B, C);  // I3
            SETVECTOR3(V, P, Q, R);  // I2
            SETVECTOR3(pu, 0, 1, 2);
            SETVECTOR3(pv, 0, 1, 2);
            z1 = 2;
          } else { // (0-0).
            SETVECTOR3(U, C, A, B);  // PT = ST
            SETVECTOR3(V, Q, P, R);  // PL = SL
            SETVECTOR3(pu, 2, 0, 1);
            SETVECTOR3(pv, 1, 0, 2);
            z1 = 3; 
          }
        }
      } else { 
        if (sB > 0) {
          if (sC < 0) { // (0+-).
            SETVECTOR3(U, A, B, C);  // I3
            SETVECTOR3(V, Q, P, R);  // PL = SL
            SETVECTOR3(pu, 0, 1, 2);
            SETVECTOR3(pv, 1, 0, 2);
            z1 = 2;
          } else {
            if (sC > 0) { // (0++).
              SETVECTOR3(U, B, C, A);  // PT = ST x ST
              SETVECTOR3(V, Q, P, R);  // PL = SL
              SETVECTOR3(pu, 1, 2, 0);
              SETVECTOR3(pv, 1, 0, 2);
              z1 = 1;
            } else { // (0+0).
              SETVECTOR3(U, C, A, B);  // PT = ST
              SETVECTOR3(V, P, Q, R);  // I2
              SETVECTOR3(pu, 2, 0, 1);
              SETVECTOR3(pv, 0, 1, 2);
              z1 = 3; 
            }
          }
        } else { // (00#)
          if (sC < 0) { // (00-).
            SETVECTOR3(U, A, B, C);  // I3
            SETVECTOR3(V, Q, P, R);  // PL = SL
            SETVECTOR3(pu, 0, 1, 2);
            SETVECTOR3(pv, 1, 0, 2);
            z1 = 3; 
          } else {
            if (sC > 0) { // (00+).
              SETVECTOR3(U, A, B, C);  // I3
              SETVECTOR3(V, P, Q, R);  // I2
              SETVECTOR3(pu, 0, 1, 2);
              SETVECTOR3(pv, 0, 1, 2);
              z1 = 3; 
            } else { // (000)
              // Not possible unless ABC is degenerate.
              // Avoiding compiler warnings.
              SETVECTOR3(U, A, B, C);  // I3
              SETVECTOR3(V, P, Q, R);  // I2
              SETVECTOR3(pu, 0, 1, 2);
              SETVECTOR3(pv, 0, 1, 2);
              z1 = 4;
            }
          }
        }
      }
    }
  }

  s1 = orient3d(U[0], U[2], R, V[1]);  // A, C, R, Q
  s2 = orient3d(U[1], U[2], R, V[0]);  // B, C, R, P

  if (s1 > 0) {
    return 0;
  }
  if (s2 < 0) {
    return 0;
  }

  if (level == 0) {
    return 1;  // They are intersected.
  }


  if (z1 == 1) {
    if (s1 == 0) {  // (0###)
      // C = Q.
      types[0] = (int) SHAREVERT;
      pos[0] = pu[2]; // C
      pos[1] = pv[1]; // Q
      types[1] = (int) DISJOINT;
    } else {
      if (s2 == 0) { // (#0##)
        // C = P.
        types[0] = (int) SHAREVERT;
        pos[0] = pu[2]; // C
        pos[1] = pv[0]; // P
        types[1] = (int) DISJOINT;
      } else { // (-+##)
        // C in [P, Q].
        types[0] = (int) ACROSSVERT;
        pos[0] = pu[2]; // C
        pos[1] = pv[0]; // [P, Q]
        types[1] = (int) DISJOINT;
      }
    }
    return 4;
  }

  s3 = orient3d(U[0], U[2], R, V[0]);  // A, C, R, P
  s4 = orient3d(U[1], U[2], R, V[1]);  // B, C, R, Q
      
  if (z1 == 0) {  // (tritri-03)
    if (s1 < 0) {
      if (s3 > 0) {
        if (s4 > 0) {
          // [P, Q] overlaps [k, l] (-+++).
          types[0] = (int) ACROSSEDGE;
          pos[0] = pu[2]; // [C, A]
          pos[1] = pv[0]; // [P, Q]
          types[1] = (int) TOUCHFACE;
          pos[2] = 3;     // [A, B, C]
          pos[3] = pv[1]; // Q
        } else {
          if (s4 == 0) {
            // Q = l, [P, Q] contains [k, l] (-++0).
            types[0] = (int) ACROSSEDGE;
            pos[0] = pu[2]; // [C, A]
            pos[1] = pv[0]; // [P, Q]
            types[1] = (int) TOUCHEDGE;
            pos[2] = pu[1]; // [B, C]
            pos[3] = pv[1]; // Q
          } else { // s4 < 0
            // [P, Q] contains [k, l] (-++-).
            types[0] = (int) ACROSSEDGE;
            pos[0] = pu[2]; // [C, A]
            pos[1] = pv[0]; // [P, Q]
            types[1] = (int) ACROSSEDGE;
            pos[2] = pu[1]; // [B, C]
            pos[3] = pv[0]; // [P, Q]
          }
        }
      } else {
        if (s3 == 0) {
          if (s4 > 0) {
            // P = k, [P, Q] in [k, l] (-+0+).
            types[0] = (int) TOUCHEDGE;
            pos[0] = pu[2]; // [C, A]
            pos[1] = pv[0]; // P
            types[1] = (int) TOUCHFACE;
            pos[2] = 3;     // [A, B, C]
            pos[3] = pv[1]; // Q
          } else {
            if (s4 == 0) {
              // [P, Q] = [k, l] (-+00).
              types[0] = (int) TOUCHEDGE;
              pos[0] = pu[2]; // [C, A]
              pos[1] = pv[0]; // P
              types[1] = (int) TOUCHEDGE;
              pos[2] = pu[1]; // [B, C]
              pos[3] = pv[1]; // Q
            } else {
              // P = k, [P, Q] contains [k, l] (-+0-).
              types[0] = (int) TOUCHEDGE;
              pos[0] = pu[2]; // [C, A]
              pos[1] = pv[0]; // P
              types[1] = (int) ACROSSEDGE;
              pos[2] = pu[1]; // [B, C]
              pos[3] = pv[0]; // [P, Q]
            }
          }
        } else { // s3 < 0
          if (s2 > 0) {
            if (s4 > 0) {
              // [P, Q] in [k, l] (-+-+).
              types[0] = (int) TOUCHFACE;
              pos[0] = 3;     // [A, B, C]
              pos[1] = pv[0]; // P
              types[1] = (int) TOUCHFACE;
              pos[2] = 3;     // [A, B, C]
              pos[3] = pv[1]; // Q
            } else {
              if (s4 == 0) {
                // Q = l, [P, Q] in [k, l] (-+-0).
                types[0] = (int) TOUCHFACE;
                pos[0] = 3;     // [A, B, C]
                pos[1] = pv[0]; // P
                types[1] = (int) TOUCHEDGE;
                pos[2] = pu[1]; // [B, C]
                pos[3] = pv[1]; // Q
              } else { // s4 < 0
                // [P, Q] overlaps [k, l] (-+--).
                types[0] = (int) TOUCHFACE;
                pos[0] = 3;     // [A, B, C]
                pos[1] = pv[0]; // P
                types[1] = (int) ACROSSEDGE;
                pos[2] = pu[1]; // [B, C]
                pos[3] = pv[0]; // [P, Q]
              }
            }
          } else { // s2 == 0
            // P = l (#0##).
            types[0] = (int) TOUCHEDGE;
            pos[0] = pu[1]; // [B, C]
            pos[1] = pv[0]; // P
            types[1] = (int) DISJOINT;
          }
        }
      }
    } else { // s1 == 0
      // Q = k (0####)
      types[0] = (int) TOUCHEDGE;
      pos[0] = pu[2]; // [C, A]
      pos[1] = pv[1]; // Q
      types[1] = (int) DISJOINT;
    }
  } else if (z1 == 2) {  // (tritri-23)
    if (s1 < 0) {
      if (s3 > 0) {
        if (s4 > 0) {
          // [P, Q] overlaps [A, l] (-+++).
          types[0] = (int) ACROSSVERT;
          pos[0] = pu[0]; // A
          pos[1] = pv[0]; // [P, Q]
          types[1] = (int) TOUCHFACE;
          pos[2] = 3;     // [A, B, C]
          pos[3] = pv[1]; // Q
        } else {
          if (s4 == 0) {
            // Q = l, [P, Q] contains [A, l] (-++0).
            types[0] = (int) ACROSSVERT;
            pos[0] = pu[0]; // A
            pos[1] = pv[0]; // [P, Q]
            types[1] = (int) TOUCHEDGE;
            pos[2] = pu[1]; // [B, C]
            pos[3] = pv[1]; // Q
          } else { // s4 < 0
            // [P, Q] contains [A, l] (-++-).
            types[0] = (int) ACROSSVERT;
            pos[0] = pu[0]; // A
            pos[1] = pv[0]; // [P, Q]
            types[1] = (int) ACROSSEDGE;
            pos[2] = pu[1]; // [B, C]
            pos[3] = pv[0]; // [P, Q]
          }
        }
      } else {
        if (s3 == 0) {
          if (s4 > 0) {
            // P = A, [P, Q] in [A, l] (-+0+).
            types[0] = (int) SHAREVERT;
            pos[0] = pu[0]; // A
            pos[1] = pv[0]; // P
            types[1] = (int) TOUCHFACE;
            pos[2] = 3;     // [A, B, C]
            pos[3] = pv[1]; // Q
          } else {
            if (s4 == 0) {
              // [P, Q] = [A, l] (-+00).
              types[0] = (int) SHAREVERT;
              pos[0] = pu[0]; // A
              pos[1] = pv[0]; // P
              types[1] = (int) TOUCHEDGE;
              pos[2] = pu[1]; // [B, C]
              pos[3] = pv[1]; // Q
            } else { // s4 < 0
              // Q = l, [P, Q] in [A, l] (-+0-).
              types[0] = (int) SHAREVERT;
              pos[0] = pu[0]; // A
              pos[1] = pv[0]; // P
              types[1] = (int) ACROSSEDGE;
              pos[2] = pu[1]; // [B, C]
              pos[3] = pv[0]; // [P, Q]
            }
          }
        } else { // s3 < 0
          if (s2 > 0) {
            if (s4 > 0) {
              // [P, Q] in [A, l] (-+-+).
              types[0] = (int) TOUCHFACE;
              pos[0] = 3;     // [A, B, C]
              pos[1] = pv[0]; // P
              types[0] = (int) TOUCHFACE;
              pos[0] = 3;     // [A, B, C]
              pos[1] = pv[1]; // Q
            } else {
              if (s4 == 0) {
                // Q = l, [P, Q] in [A, l] (-+-0).
                types[0] = (int) TOUCHFACE;
                pos[0] = 3;     // [A, B, C]
                pos[1] = pv[0]; // P
                types[0] = (int) TOUCHEDGE;
                pos[0] = pu[1]; // [B, C]
                pos[1] = pv[1]; // Q
              } else { // s4 < 0
                // [P, Q] overlaps [A, l] (-+--).
                types[0] = (int) TOUCHFACE;
                pos[0] = 3;     // [A, B, C]
                pos[1] = pv[0]; // P
                types[0] = (int) ACROSSEDGE;
                pos[0] = pu[1]; // [B, C]
                pos[1] = pv[0]; // [P, Q]
              }
            }
          } else { // s2 == 0
            // P = l (#0##).
            types[0] = (int) TOUCHEDGE;
            pos[0] = pu[1]; // [B, C]
            pos[1] = pv[0]; // P
            types[1] = (int) DISJOINT;
          }
        }
      }
    } else { // s1 == 0
      // Q = A (0###).
      types[0] = (int) SHAREVERT;
      pos[0] = pu[0]; // A
      pos[1] = pv[1]; // Q
      types[1] = (int) DISJOINT;
    }
  } else if (z1 == 3) {  // (tritri-33)
    if (s1 < 0) {
      if (s3 > 0) {
        if (s4 > 0) {
          // [P, Q] overlaps [A, B] (-+++).
          types[0] = (int) ACROSSVERT;
          pos[0] = pu[0]; // A
          pos[1] = pv[0]; // [P, Q]
          types[1] = (int) TOUCHEDGE;
          pos[2] = pu[0]; // [A, B]
          pos[3] = pv[1]; // Q
        } else {
          if (s4 == 0) {
            // Q = B, [P, Q] contains [A, B] (-++0).
            types[0] = (int) ACROSSVERT;
            pos[0] = pu[0]; // A
            pos[1] = pv[0]; // [P, Q]
            types[1] = (int) SHAREVERT;
            pos[2] = pu[1]; // B
            pos[3] = pv[1]; // Q
          } else { // s4 < 0
            // [P, Q] contains [A, B] (-++-).
            types[0] = (int) ACROSSVERT;
            pos[0] = pu[0]; // A
            pos[1] = pv[0]; // [P, Q]
            types[1] = (int) ACROSSVERT;
            pos[2] = pu[1]; // B
            pos[3] = pv[0]; // [P, Q]
          }
        }
      } else {
        if (s3 == 0) {
          if (s4 > 0) {
            // P = A, [P, Q] in [A, B] (-+0+).
            types[0] = (int) SHAREVERT;
            pos[0] = pu[0]; // A
            pos[1] = pv[0]; // P
            types[1] = (int) TOUCHEDGE;
            pos[2] = pu[0]; // [A, B]
            pos[3] = pv[1]; // Q
          } else {
            if (s4 == 0) {
              // [P, Q] = [A, B] (-+00).
              types[0] = (int) SHAREEDGE;
              pos[0] = pu[0]; // [A, B]
              pos[1] = pv[0]; // [P, Q]
              types[1] = (int) DISJOINT;
            } else { // s4 < 0
              // P= A, [P, Q] in [A, B] (-+0-).
              types[0] = (int) SHAREVERT;
              pos[0] = pu[0]; // A
              pos[1] = pv[0]; // P
              types[1] = (int) ACROSSVERT;
              pos[2] = pu[1]; // B
              pos[3] = pv[0]; // [P, Q]
            }
          }
        } else { // s3 < 0
          if (s2 > 0) {
            if (s4 > 0) {
              // [P, Q] in [A, B] (-+-+).
              types[0] = (int) TOUCHEDGE;
              pos[0] = pu[0]; // [A, B]
              pos[1] = pv[0]; // P
              types[1] = (int) TOUCHEDGE;
              pos[2] = pu[0]; // [A, B]
              pos[3] = pv[1]; // Q
            } else {
              if (s4 == 0) {
                // Q = B, [P, Q] in [A, B] (-+-0).
                types[0] = (int) TOUCHEDGE;
                pos[0] = pu[0]; // [A, B]
                pos[1] = pv[0]; // P
                types[1] = (int) SHAREVERT;
                pos[2] = pu[1]; // B
                pos[3] = pv[1]; // Q
              } else { // s4 < 0
                // [P, Q] overlaps [A, B] (-+--).
                types[0] = (int) TOUCHEDGE;
                pos[0] = pu[0]; // [A, B]
                pos[1] = pv[0]; // P
                types[1] = (int) ACROSSVERT;
                pos[2] = pu[1]; // B
                pos[3] = pv[0]; // [P, Q]
              }
            }
          } else { // s2 == 0
            // P = B (#0##).
            types[0] = (int) SHAREVERT;
            pos[0] = pu[1]; // B
            pos[1] = pv[0]; // P
            types[1] = (int) DISJOINT;
          }
        }
      }
    } else { // s1 == 0
      // Q = A (0###).
      types[0] = (int) SHAREVERT;
      pos[0] = pu[0]; // A
      pos[1] = pv[1]; // Q
      types[1] = (int) DISJOINT;
    }
  }

  return 4;
}